

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL_bool Surface20to12InPlace(SDL_Surface *surface20,SDL12_Surface *surface12)

{
  SDL12_PixelFormat *pSVar1;
  long lVar2;
  undefined8 uVar3;
  code *pcVar4;
  int iVar5;
  SDL_AssertState SVar6;
  SDL_bool SVar7;
  SDL12_PixelFormat *pSVar8;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  Uint32 flags;
  SDL12_PixelFormat *format12;
  SDL12_Palette *palette12;
  SDL12_Surface *pSStack_20;
  SDL_BlendMode blendmode;
  SDL12_Surface *surface12_local;
  SDL_Surface *surface20_local;
  
  palette12._4_4_ = 0;
  format12 = (SDL12_PixelFormat *)0x0;
  if (surface20 == (SDL_Surface *)0x0) {
    surface20_local._4_4_ = SDL_FALSE;
  }
  else {
    pSStack_20 = surface12;
    surface12_local = (SDL12_Surface *)surface20;
    if (surface20->pitch < 0x10000) {
      if (((surface20->format->palette == (SDL_Palette *)0x0) ||
          (format12 = (SDL12_PixelFormat *)(*SDL20_malloc)(0x10),
          format12 != (SDL12_PixelFormat *)0x0)) &&
         (pSVar8 = (SDL12_PixelFormat *)(*SDL20_malloc)(0x30), pSVar8 != (SDL12_PixelFormat *)0x0))
      {
        if (format12 != (SDL12_PixelFormat *)0x0) {
          (*SDL20_memset)(format12,0,0x10);
          do {
            pSVar1 = surface12_local->format;
            lVar2._0_1_ = pSVar1->BitsPerPixel;
            lVar2._1_1_ = pSVar1->BytesPerPixel;
            lVar2._2_1_ = pSVar1->Rloss;
            lVar2._3_1_ = pSVar1->Gloss;
            lVar2._4_1_ = pSVar1->Bloss;
            lVar2._5_1_ = pSVar1->Aloss;
            lVar2._6_1_ = pSVar1->Rshift;
            lVar2._7_1_ = pSVar1->Gshift;
            if (lVar2 != 0) goto LAB_00120c7f;
            SVar6 = (*SDL20_ReportAssertion)
                              (&Surface20to12InPlace::sdl_assert_data,"Surface20to12InPlace",
                               "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                               ,0x1481);
          } while (SVar6 == SDL_ASSERTION_RETRY);
          if (SVar6 == SDL_ASSERTION_BREAK) {
            pcVar4 = (code *)swi(3);
            SVar7 = (*pcVar4)();
            return SVar7;
          }
LAB_00120c7f:
          *(undefined4 *)&format12->palette =
               **(undefined4 **)&surface12_local->format->BitsPerPixel;
          uVar3 = *(undefined8 *)(*(long *)&surface12_local->format->BitsPerPixel + 8);
          format12->BitsPerPixel = (char)uVar3;
          format12->BytesPerPixel = (char)((ulong)uVar3 >> 8);
          format12->Rloss = (char)((ulong)uVar3 >> 0x10);
          format12->Gloss = (char)((ulong)uVar3 >> 0x18);
          format12->Bloss = (char)((ulong)uVar3 >> 0x20);
          format12->Aloss = (char)((ulong)uVar3 >> 0x28);
          format12->Rshift = (char)((ulong)uVar3 >> 0x30);
          format12->Gshift = (char)((ulong)uVar3 >> 0x38);
        }
        (*SDL20_memset)(pSVar8,0,0x30);
        pSVar8->palette = (SDL12_Palette *)format12;
        pSVar8->BitsPerPixel = surface12_local->format->Bshift;
        pSVar8->BytesPerPixel = surface12_local->format->Ashift;
        pSVar8->Rloss = (Uint8)surface12_local->format->colorkey;
        pSVar8->Gloss = *(Uint8 *)((long)&surface12_local->format->colorkey + 1);
        pSVar8->Bloss = *(Uint8 *)((long)&surface12_local->format->colorkey + 2);
        pSVar8->Aloss = *(Uint8 *)((long)&surface12_local->format->colorkey + 3);
        pSVar8->Rshift = surface12_local->format->alpha;
        pSVar8->Gshift = surface12_local->format->field_0x29;
        pSVar8->Bshift = surface12_local->format->field_0x2a;
        pSVar8->Ashift = surface12_local->format->field_0x2b;
        pSVar8->Rmask = surface12_local->format->Rmask;
        pSVar8->Gmask = surface12_local->format->Gmask;
        pSVar8->Bmask = surface12_local->format->Bmask;
        pSVar8->Amask = surface12_local->format->Amask;
        iVar5 = (*SDL20_GetColorKey)((SDL_Surface *)surface12_local,&pSVar8->colorkey);
        if (iVar5 < 0) {
          pSVar8->colorkey = 0;
        }
        else {
          pSStack_20->flags = pSStack_20->flags | 0x1000;
        }
        iVar5 = (*SDL20_GetSurfaceAlphaMod)((SDL_Surface *)surface12_local,&pSVar8->alpha);
        if (iVar5 < 0) {
          pSVar8->alpha = 0xff;
        }
        (*SDL20_memset)(pSStack_20,0,0x58);
        SVar6 = surface12_local->flags;
        sdl_assert_state_1 = SVar6 & 0xfffffff7;
        if ((surface12_local->flags & 1) != 0) {
          pSStack_20->flags = pSStack_20->flags | 0x1000000;
          sdl_assert_state_1 = SVar6 & 0xfffffff6;
        }
        if ((surface12_local->flags & 2) != 0) {
          pSStack_20->flags = pSStack_20->flags | 0x4000;
          sdl_assert_state_1 = sdl_assert_state_1 & ~SDL_ASSERTION_ABORT;
        }
        do {
          if (sdl_assert_state_1 == SDL_ASSERTION_RETRY) goto LAB_00120ed8;
          SVar6 = (*SDL20_ReportAssertion)
                            (&Surface20to12InPlace::sdl_assert_data_1,"Surface20to12InPlace",
                             "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                             ,0x14a9);
        } while (SVar6 == SDL_ASSERTION_RETRY);
        if (SVar6 == SDL_ASSERTION_BREAK) {
          pcVar4 = (code *)swi(3);
          SVar7 = (*pcVar4)();
          return SVar7;
        }
LAB_00120ed8:
        iVar5 = (*SDL20_GetSurfaceBlendMode)
                          ((SDL_Surface *)surface12_local,(SDL_BlendMode *)((long)&palette12 + 4));
        if ((iVar5 == 0) && (palette12._4_4_ == 1)) {
          pSStack_20->flags = pSStack_20->flags | 0x10000;
        }
        pSStack_20->format = pSVar8;
        pSStack_20->w = surface12_local->w;
        pSStack_20->h = surface12_local->h;
        pSStack_20->pitch = (Uint16)*(undefined4 *)&surface12_local->pitch;
        pSStack_20->pixels = surface12_local->pixels;
        pSStack_20->offset = 0;
        pSStack_20->surface20 = (SDL_Surface *)surface12_local;
        Rect20to12((SDL_Rect *)&surface12_local->unused1,&pSStack_20->clip_rect);
        pSStack_20->refcount = surface12_local[1].flags;
        surface20_local._4_4_ = SDL_TRUE;
      }
      else {
        (*SDL20_free)(format12);
        (*SDL20_free)((void *)0x0);
        surface20_local._4_4_ = SDL_FALSE;
      }
    }
    else {
      (*SDL20_SetError)("Pitch is too large");
      surface20_local._4_4_ = SDL_FALSE;
    }
  }
  return surface20_local._4_4_;
}

Assistant:

static SDL_bool
Surface20to12InPlace(SDL_Surface *surface20,
                     SDL12_Surface *surface12)
{
    SDL_BlendMode blendmode = SDL_BLENDMODE_NONE;
    SDL12_Palette *palette12 = NULL;
    SDL12_PixelFormat *format12 = NULL;
    Uint32 flags = 0;

    if (!surface20) {
        return SDL_FALSE;
    }
    if (surface20->pitch > 65535) {
        SDL20_SetError("Pitch is too large");  /* can't fit to 16-bits */
        return SDL_FALSE;
    }

    if (surface20->format->palette) {
        palette12 = (SDL12_Palette *) SDL20_malloc(sizeof (SDL12_Palette));
        if (!palette12) {
            goto failed;
        }
    }

    format12 = (SDL12_PixelFormat *) SDL20_malloc(sizeof (SDL12_PixelFormat));
    if (!format12) {
        goto failed;
    }

    if (palette12) {
        SDL20_zerop(palette12);
        SDL_assert(surface20->format->palette);
        palette12->ncolors = surface20->format->palette->ncolors;
        palette12->colors = surface20->format->palette->colors;
    }

    SDL20_zerop(format12);
    format12->palette = palette12;
    format12->BitsPerPixel = surface20->format->BitsPerPixel;
    format12->BytesPerPixel = surface20->format->BytesPerPixel;
    format12->Rloss = surface20->format->Rloss;
    format12->Gloss = surface20->format->Gloss;
    format12->Bloss = surface20->format->Bloss;
    format12->Aloss = surface20->format->Aloss;
    format12->Rshift = surface20->format->Rshift;
    format12->Gshift = surface20->format->Gshift;
    format12->Bshift = surface20->format->Bshift;
    format12->Ashift = surface20->format->Ashift;
    format12->Rmask = surface20->format->Rmask;
    format12->Gmask = surface20->format->Gmask;
    format12->Bmask = surface20->format->Bmask;
    format12->Amask = surface20->format->Amask;

    if (SDL20_GetColorKey(surface20, &format12->colorkey) < 0) {
        format12->colorkey = 0;
    } else {
        surface12->flags |= SDL12_SRCCOLORKEY;
    }

    if (SDL20_GetSurfaceAlphaMod(surface20, &format12->alpha) < 0) {
        format12->alpha = 255;
    }

    SDL20_zerop(surface12);
    flags = surface20->flags;
    flags &= ~SDL_SIMD_ALIGNED;  /* we don't need to map this to 1.2 */
    #define MAPSURFACEFLAGS(fl) { if (surface20->flags & SDL_##fl) { surface12->flags |= SDL12_##fl; flags &= ~SDL_##fl; } }
    MAPSURFACEFLAGS(PREALLOC);
    MAPSURFACEFLAGS(RLEACCEL);
    /*MAPSURFACEFLAGS(DONTFREE);*/
    #undef MAPSURFACEFLAGS
    SDL_assert(flags == 0);  /* non-zero if there's a flag we didn't map. */

    if ((SDL20_GetSurfaceBlendMode(surface20, &blendmode) == 0) && (blendmode == SDL_BLENDMODE_BLEND)) {
        surface12->flags |= SDL12_SRCALPHA;
    }

    surface12->format = format12;
    surface12->w = surface20->w;
    surface12->h = surface20->h;
    surface12->pitch = (Uint16) surface20->pitch;
    surface12->pixels = surface20->pixels;
    surface12->offset = 0;
    surface12->surface20 = surface20;
    Rect20to12(&surface20->clip_rect, &surface12->clip_rect);
    surface12->refcount = surface20->refcount;

    return SDL_TRUE;

failed:
    SDL20_free(palette12);
    SDL20_free(format12);
    return SDL_FALSE;
}